

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.cc
# Opt level: O2

void __thiscall xLearn::Model::deserialize_w_v_b(Model *this,FILE *file)

{
  int iVar1;
  
  ReadDataFromDisk(file,(char *)&this->param_num_w_,4);
  iVar1 = std::__cxx11::string::compare((char *)this);
  if (iVar1 != 0) {
    ReadDataFromDisk(file,(char *)&this->param_num_v_,4);
  }
  initial(this,false);
  ReadDataFromDisk(file,(char *)this->param_w_,(ulong)this->param_num_w_ << 2);
  ReadDataFromDisk(file,(char *)this->param_b_,(ulong)this->aux_size_ << 2);
  iVar1 = std::__cxx11::string::compare((char *)this);
  if (iVar1 != 0) {
    ReadDataFromDisk(file,(char *)this->param_v_,(ulong)this->param_num_v_ << 2);
    return;
  }
  return;
}

Assistant:

void Model::deserialize_w_v_b(FILE* file) {
  // Read size of w
  ReadDataFromDisk(file, (char*)&param_num_w_, sizeof(param_num_w_));
  // Read size of v
  if (score_func_.compare("linear") != 0) {
    ReadDataFromDisk(file, (char*)&param_num_v_, sizeof(param_num_v_));
  }
  // Allocate memory. Don't set value here
  this->initial(false);
  // Read w
  ReadDataFromDisk(file, (char*)param_w_, sizeof(real_t)*param_num_w_);
  // Read b
  ReadDataFromDisk(file, (char*)param_b_, sizeof(real_t)*aux_size_);
  // Read v
  if (score_func_.compare("linear") != 0) {
    ReadDataFromDisk(file, (char*)param_v_, sizeof(real_t)*param_num_v_);
  }
}